

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O1

void __thiscall sjtu::UserManager::add_user(UserManager *this,int argc,string *argv)

{
  string *psVar1;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar2;
  bool bVar3;
  UserManager *pUVar4;
  int iVar5;
  undefined1 *puVar6;
  int *piVar7;
  undefined4 extraout_var_00;
  char *pcVar8;
  long *plVar9;
  undefined8 uVar10;
  long lVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong uVar12;
  ulong uVar13;
  value_type *pvVar14;
  int *__dest;
  long lVar15;
  int iVar16;
  string *psVar17;
  bool bVar18;
  pair<long,_bool> pVar19;
  string usname;
  string current;
  string uspass;
  string umail;
  string uname;
  allocator local_191;
  int *local_190;
  int *local_188;
  long *local_180;
  UserManager *local_178;
  char *local_170;
  char local_168;
  value_type local_160;
  char local_150;
  undefined7 uStack_14f;
  value_type local_140;
  undefined1 local_130;
  undefined7 uStack_12f;
  value_type local_120;
  char local_110;
  undefined7 uStack_10f;
  value_type local_100;
  char local_f0;
  undefined7 uStack_ef;
  value_type local_e0;
  char local_d0;
  undefined7 uStack_cf;
  string *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long local_90 [2];
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50 [2];
  value_type local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  local_178 = this;
  if (this->UserBpTree->root == -1) {
    iVar16 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[1])()
    ;
    piVar7 = (int *)CONCAT44(extraout_var,iVar16);
    local_180 = (long *)(piVar7 + 0x1e);
    *(undefined8 *)(piVar7 + 0x1e) = extraout_RDX;
    piVar7[0x1a] = 10;
    if (0 < argc) {
      local_188 = (int *)((long)piVar7 + 0x49);
      local_190 = piVar7 + 0xd;
      iVar16 = 0;
      do {
        iVar5 = std::__cxx11::string::compare((char *)argv);
        __dest = piVar7;
        if ((((iVar5 == 0) ||
             (iVar5 = std::__cxx11::string::compare((char *)argv),
             __dest = (int *)((long)piVar7 + 0x15), iVar5 == 0)) ||
            (iVar5 = std::__cxx11::string::compare((char *)argv), __dest = local_190, iVar5 == 0))
           || (iVar5 = std::__cxx11::string::compare((char *)argv), __dest = local_188, iVar5 == 0))
        {
          strcpy((char *)__dest,argv[1]._M_dataplus._M_p);
        }
        argv = argv + 2;
        iVar16 = iVar16 + 2;
      } while (iVar16 < argc);
    }
    pUVar4 = local_178;
    plVar9 = local_180;
    piVar7[0x1b] = 0;
    (*(local_178->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
              (local_178->UserFile,local_180);
    pBVar2 = pUVar4->UserBpTree;
    std::__cxx11::string::string((string *)&local_60,(char *)piVar7,(allocator *)&local_120);
    if (local_58 == 0) {
      local_160.first = 0;
    }
    else {
      lVar15 = 0;
      lVar11 = 0;
      uVar13 = 0;
      do {
        uVar12 = (ulong)((int)*(char *)((long)local_60 + lVar15) + 0x100);
        lVar11 = (long)(lVar11 * 0x239 + uVar12) % 0x3b800001;
        uVar13 = (long)(uVar13 * 0x301 + uVar12) % 0x3b9aca07;
        lVar15 = lVar15 + 1;
      } while (local_58 != lVar15);
      local_160.first = lVar11 << 0x20 | uVar13;
    }
    local_160.second = *plVar9;
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
              (pBVar2,&local_160);
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
  }
  else {
    local_160.first = (unsigned_long_long)&local_150;
    iVar16 = 0;
    local_160.second = 0;
    local_150 = '\0';
    local_120.first = (unsigned_long_long)&local_110;
    local_120.second = 0;
    local_110 = '\0';
    local_e0.first = (unsigned_long_long)&local_d0;
    local_e0.second = 0;
    local_d0 = '\0';
    local_100.first = (unsigned_long_long)&local_f0;
    local_100.second = 0;
    local_f0 = '\0';
    local_190 = (int *)&local_130;
    local_140.second = 0;
    local_130 = 0;
    local_140.first = (unsigned_long_long)local_190;
    if (0 < argc) {
      psVar17 = argv + 1;
      do {
        psVar1 = psVar17 + -1;
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        pvVar14 = &local_160;
        if (iVar5 == 0) {
LAB_0010507b:
          std::__cxx11::string::_M_assign((string *)pvVar14);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)psVar1);
          pvVar14 = &local_120;
          if (iVar5 == 0) goto LAB_0010507b;
          iVar5 = std::__cxx11::string::compare((char *)psVar1);
          pvVar14 = &local_e0;
          if (iVar5 == 0) goto LAB_0010507b;
          iVar5 = std::__cxx11::string::compare((char *)psVar1);
          pvVar14 = &local_100;
          if (iVar5 == 0) goto LAB_0010507b;
          iVar5 = std::__cxx11::string::compare((char *)psVar1);
          pvVar14 = &local_140;
          if (iVar5 == 0) goto LAB_0010507b;
          iVar5 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar5 == 0) {
            pcVar8 = (psVar17->_M_dataplus)._M_p;
            local_188 = __errno_location();
            local_180 = (long *)CONCAT44(local_180._4_4_,*local_188);
            *local_188 = 0;
            puVar6 = (undefined1 *)strtol(pcVar8,&local_170,10);
            if (local_170 == pcVar8) {
LAB_001057ff:
              uVar10 = std::__throw_invalid_argument("stoi");
              if (local_c0 != psVar17) {
                operator_delete(local_c0,(ulong)(local_b0._0_8_ + 1));
              }
              if ((undefined1 *)local_140.first != &local_130) {
                operator_delete((void *)local_140.first,CONCAT71(uStack_12f,local_130) + 1);
              }
              if ((char *)local_100.first != &local_f0) {
                operator_delete((void *)local_100.first,CONCAT71(uStack_ef,local_f0) + 1);
              }
              if ((char *)local_e0.first != &local_d0) {
                operator_delete((void *)local_e0.first,CONCAT71(uStack_cf,local_d0) + 1);
              }
              if ((char *)local_120.first != &local_110) {
                operator_delete((void *)local_120.first,CONCAT71(uStack_10f,local_110) + 1);
              }
              if ((char *)local_160.first != &local_150) {
                operator_delete((void *)local_160.first,CONCAT71(uStack_14f,local_150) + 1);
              }
              _Unwind_Resume(uVar10);
            }
            local_190 = (int *)puVar6;
            if (((undefined1 *)(long)(int)puVar6 != puVar6) || (*local_188 == 0x22)) {
              std::__throw_out_of_range("stoi");
              goto LAB_001057ff;
            }
            if (*local_188 == 0) {
              *local_188 = (int)local_180;
            }
          }
        }
        psVar17 = psVar17 + 2;
        iVar16 = iVar16 + 2;
      } while (iVar16 < argc);
    }
    pUVar4 = local_178;
    pBVar2 = local_178->UserBpTree;
    local_a0._M_allocated_capacity = (size_type)local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_b0 + 0x10),local_140.first,
               (undefined1 *)(local_140.first + local_140.second));
    if (local_a0._8_8_ == 0) {
      local_40.first = 0;
    }
    else {
      lVar15 = 0;
      lVar11 = 0;
      local_40.first = 0;
      do {
        uVar13 = (ulong)((int)*(char *)(local_a0._M_allocated_capacity + lVar15) + 0x100);
        lVar11 = (long)(lVar11 * 0x239 + uVar13) % 0x3b800001;
        local_40.first = (long)(local_40.first * 0x301 + uVar13) % 0x3b9aca07;
        lVar15 = lVar15 + 1;
      } while (local_a0._8_8_ != lVar15);
      local_40.first = lVar11 << 0x20 | local_40.first;
    }
    pVar19 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                       (pBVar2,&local_40.first);
    local_170 = (char *)pVar19.first;
    local_168 = pVar19.second;
    if ((long *)local_a0._M_allocated_capacity != local_90) {
      operator_delete((void *)local_a0._M_allocated_capacity,local_90[0] + 1);
    }
    if (local_168 == '\x01') {
      iVar16 = (*(pUVar4->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base
                 [2])(pUVar4->UserFile,&local_170);
      if ((*(uint *)(CONCAT44(extraout_var_00,iVar16) + 0x6c) == pUVar4->online_flag) &&
         ((int)local_190 < *(int *)(CONCAT44(extraout_var_00,iVar16) + 0x68))) {
        pBVar2 = pUVar4->UserBpTree;
        local_c0 = (string *)local_b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,local_160.first,(char *)(local_160.first + local_160.second))
        ;
        if (local_b8 == 0) {
          local_40.first = 0;
        }
        else {
          lVar15 = 0;
          lVar11 = 0;
          local_40.first = 0;
          do {
            uVar13 = (ulong)((int)*(char *)((long)&(local_c0->_M_dataplus)._M_p + lVar15) + 0x100);
            lVar11 = (long)(lVar11 * 0x239 + uVar13) % 0x3b800001;
            local_40.first = (long)(local_40.first * 0x301 + uVar13) % 0x3b9aca07;
            lVar15 = lVar15 + 1;
          } while (local_b8 != lVar15);
          local_40.first = lVar11 << 0x20 | local_40.first;
        }
        pVar19 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                           (pBVar2,&local_40.first);
        bVar18 = ((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
        bVar3 = true;
      }
      else {
        bVar3 = false;
        bVar18 = false;
      }
      if ((bVar3) && (local_c0 != (string *)local_b0)) {
        operator_delete(local_c0,(ulong)(local_b0._0_8_ + 1));
      }
      if (bVar18) {
        iVar16 = (*(pUVar4->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base
                   [1])();
        pcVar8 = (char *)CONCAT44(extraout_var_01,iVar16);
        *(undefined8 *)(pcVar8 + 0x78) = extraout_RDX_00;
        strcpy(pcVar8,(char *)local_160.first);
        strcpy(pcVar8 + 0x15,(char *)local_120.first);
        strcpy(pcVar8 + 0x34,(char *)local_e0.first);
        strcpy(pcVar8 + 0x49,(char *)local_100.first);
        *(int *)(pcVar8 + 0x68) = (int)local_190;
        pcVar8[0x6c] = '\0';
        pcVar8[0x6d] = '\0';
        pcVar8[0x6e] = '\0';
        pcVar8[0x6f] = '\0';
        (*(pUVar4->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
                  (pUVar4->UserFile,pcVar8 + 0x78);
        pBVar2 = pUVar4->UserBpTree;
        std::__cxx11::string::string((string *)&local_80,pcVar8,&local_191);
        if (local_78 == 0) {
          local_40.first = 0;
        }
        else {
          lVar15 = 0;
          lVar11 = 0;
          local_40.first = 0;
          do {
            uVar13 = (ulong)((int)*(char *)((long)local_80 + lVar15) + 0x100);
            lVar11 = (long)(lVar11 * 0x239 + uVar13) % 0x3b800001;
            local_40.first = (long)(local_40.first * 0x301 + uVar13) % 0x3b9aca07;
            lVar15 = lVar15 + 1;
          } while (local_78 != lVar15);
          local_40.first = lVar11 << 0x20 | local_40.first;
        }
        local_40.second = *(long *)(pcVar8 + 0x78);
        BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
                  (pBVar2,&local_40);
        if (local_80 != local_70) {
          operator_delete(local_80,local_70[0] + 1);
        }
        plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
      }
      else {
        plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
      }
    }
    else {
      plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
    }
    if ((undefined1 *)local_140.first != &local_130) {
      operator_delete((void *)local_140.first,CONCAT71(uStack_12f,local_130) + 1);
    }
    if ((char *)local_100.first != &local_f0) {
      operator_delete((void *)local_100.first,CONCAT71(uStack_ef,local_f0) + 1);
    }
    if ((char *)local_e0.first != &local_d0) {
      operator_delete((void *)local_e0.first,CONCAT71(uStack_cf,local_d0) + 1);
    }
    if ((char *)local_120.first != &local_110) {
      operator_delete((void *)local_120.first,CONCAT71(uStack_10f,local_110) + 1);
    }
    if ((char *)local_160.first != &local_150) {
      operator_delete((void *)local_160.first,CONCAT71(uStack_14f,local_150) + 1);
    }
  }
  return;
}

Assistant:

void add_user(int argc, std::string *argv) {
            if (UserBpTree->empty()) {
                auto ret = UserFile->newspace();
                userType *user = ret.first;
                user->offset = ret.second;
                user->privilege = 10;
                for (int i = 0; i < argc; i += 2) {
                    if (argv[i] == "-u") strcpy(user->username, argv[i + 1].c_str());
                    else if (argv[i] == "-p") strcpy(user->password, argv[i + 1].c_str());
                    else if (argv[i] == "-n") strcpy(user->name, argv[i + 1].c_str());
                    else if (argv[i] == "-m") strcpy(user->mailAddr, argv[i + 1].c_str());
                }
                user->is_online = 0;
                UserFile->save(user->offset);
                UserBpTree->insert(BplusTree<StringHasher::hashType , locType>::value_type(hasher(user->username), user->offset));
                std::cout << 0 << std::endl;
            } else {
                std::string usname, uspass, uname, umail, current;
                int upri;
                for (int i = 0; i < argc; i += 2) {
                    if (argv[i] == "-u") usname = argv[i + 1];
                    else if (argv[i] == "-p") uspass = argv[i + 1];
                    else if (argv[i] == "-n") uname = argv[i + 1];
                    else if (argv[i] == "-m") umail = argv[i + 1];
                    else if (argv[i] == "-c") current = argv[i + 1];
                    else if (argv[i] == "-g") upri = stoi(argv[i + 1]);
                }
                std::pair<locType, bool> tmp = UserBpTree->find(hasher(current));
                if (tmp.second)
		{
			userType *curuser = UserFile->read(tmp.first);
			if (curuser -> is_online == online_flag && curuser->privilege > upri && UserBpTree -> find(hasher(usname)).second == false)
			{
				auto ret = UserFile -> newspace();
				userType *user = ret . first;
				user -> offset = ret . second;
				strcpy(user -> username , usname . c_str());
				strcpy(user -> password , uspass . c_str());
				strcpy(user -> name , uname . c_str());
				strcpy(user -> mailAddr , umail . c_str());
				user -> privilege = upri;
				user -> is_online = 0;
				UserFile -> save(user -> offset);
				UserBpTree -> insert(BplusTree<StringHasher::hashType , locType>::value_type(
					hasher(user -> username) , user -> offset));
				std::cout << 0 << std::endl;
			}else std::cout << -1 << std::endl;
                } else std::cout << -1 << std::endl;
            }
        }